

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqliteProcessJoin(Parse *pParse,Select *p)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  Select *pSVar9;
  int local_78;
  int iRightCol;
  int iLeftCol_1;
  int iLeft_1;
  char *zName_1;
  IdList *pList;
  int iLeftCol;
  int iLeft;
  char *zName;
  Table *pTStack_48;
  int isOuter;
  Table *pRightTab;
  SrcList_item *pRight;
  SrcList_item *pLeft;
  int j;
  int i;
  SrcList *pSrc;
  Select *p_local;
  Parse *pParse_local;
  
  _j = p->pSrc;
  pRight = _j->a;
  pRightTab = (Table *)(_j + 1);
  pLeft._4_4_ = 0;
  pSrc = (SrcList *)p;
  p_local = (Select *)pParse;
  do {
    if (_j->nSrc + -1 <= pLeft._4_4_) {
      return 0;
    }
    pTStack_48 = (Table *)pRightTab->pFKey;
    if ((pRight->pTab != (Table *)0x0) && (pTStack_48 != (Table *)0x0)) {
      zName._4_4_ = (uint)((pRightTab->nTabRef & 0x20) != 0);
      if ((pRightTab->nTabRef & 4) != 0) {
        lVar1._0_2_ = pRightTab->nRowLogEst;
        lVar1._2_2_ = pRightTab->szTabRow;
        lVar1._4_1_ = pRightTab->keyConf;
        lVar1._5_3_ = *(undefined3 *)&pRightTab->field_0x4d;
        if ((lVar1 != 0) ||
           (lVar2._0_4_ = pRightTab->addColOffset, lVar2._4_4_ = pRightTab->nModuleArg, lVar2 != 0))
        {
          sqlite3ErrorMsg((Parse *)p_local,"a NATURAL join may not have an ON or USING clause",0);
          return 1;
        }
        for (pLeft._0_4_ = 0; (int)pLeft < pTStack_48->nCol; pLeft._0_4_ = (int)pLeft + 1) {
          _iLeftCol = pTStack_48->aCol[(int)pLeft].zName;
          iVar7 = tableAndColumnIndex(_j,pLeft._4_4_ + 1,_iLeftCol,(int *)((long)&pList + 4),
                                      (int *)&pList);
          if (iVar7 != 0) {
            addWhereTerm((Parse *)p_local,_j,pList._4_4_,(int)pList,pLeft._4_4_ + 1,(int)pLeft,
                         zName._4_4_,(Expr **)&pSrc->a[0].pSelect);
          }
        }
      }
      lVar3._0_2_ = pRightTab->nRowLogEst;
      lVar3._2_2_ = pRightTab->szTabRow;
      lVar3._4_1_ = pRightTab->keyConf;
      lVar3._5_3_ = *(undefined3 *)&pRightTab->field_0x4d;
      if ((lVar3 != 0) &&
         (lVar4._0_4_ = pRightTab->addColOffset, lVar4._4_4_ = pRightTab->nModuleArg, lVar4 != 0)) {
        sqlite3ErrorMsg((Parse *)p_local,"cannot have both ON and USING clauses in the same join");
        return 1;
      }
      lVar5._0_2_ = pRightTab->nRowLogEst;
      lVar5._2_2_ = pRightTab->szTabRow;
      lVar5._4_1_ = pRightTab->keyConf;
      lVar5._5_3_ = *(undefined3 *)&pRightTab->field_0x4d;
      if (lVar5 != 0) {
        if (zName._4_4_ != 0) {
          setJoinExpr(*(Expr **)&pRightTab->nRowLogEst,pRightTab->tabFlags);
        }
        pSVar9 = (Select *)
                 sqlite3ExprAnd((sqlite3 *)p_local->pEList,(Expr *)pSrc->a[0].pSelect,
                                *(Expr **)&pRightTab->nRowLogEst);
        pSrc->a[0].pSelect = pSVar9;
        pRightTab->nRowLogEst = 0;
        pRightTab->szTabRow = 0;
        pRightTab->keyConf = '\0';
        *(undefined3 *)&pRightTab->field_0x4d = 0;
      }
      lVar6._0_4_ = pRightTab->addColOffset;
      lVar6._4_4_ = pRightTab->nModuleArg;
      if (lVar6 != 0) {
        zName_1 = *(char **)&pRightTab->addColOffset;
        for (pLeft._0_4_ = 0; (int)pLeft < *(int *)(zName_1 + 8); pLeft._0_4_ = (int)pLeft + 1) {
          _iLeftCol_1 = *(char **)(*(long *)zName_1 + (long)(int)pLeft * 0x10);
          iVar7 = columnIndex(pTStack_48,_iLeftCol_1);
          if ((iVar7 < 0) ||
             (iVar8 = tableAndColumnIndex(_j,pLeft._4_4_ + 1,_iLeftCol_1,&iRightCol,&local_78),
             iVar8 == 0)) {
            sqlite3ErrorMsg((Parse *)p_local,
                            "cannot join using column %s - column not present in both tables",
                            _iLeftCol_1);
            return 1;
          }
          addWhereTerm((Parse *)p_local,_j,iRightCol,local_78,pLeft._4_4_ + 1,iVar7,zName._4_4_,
                       (Expr **)&pSrc->a[0].pSelect);
        }
      }
    }
    pLeft._4_4_ = pLeft._4_4_ + 1;
    pRightTab = (Table *)&pRightTab->pSchema;
    pRight = pRight + 1;
  } while( true );
}

Assistant:

static int sqliteProcessJoin(Parse *pParse, Select *p){
  SrcList *pSrc;                  /* All tables in the FROM clause */
  int i, j;                       /* Loop counters */
  struct SrcList_item *pLeft;     /* Left table being joined */
  struct SrcList_item *pRight;    /* Right table being joined */

  pSrc = p->pSrc;
  pLeft = &pSrc->a[0];
  pRight = &pLeft[1];
  for(i=0; i<pSrc->nSrc-1; i++, pRight++, pLeft++){
    Table *pRightTab = pRight->pTab;
    int isOuter;

    if( NEVER(pLeft->pTab==0 || pRightTab==0) ) continue;
    isOuter = (pRight->fg.jointype & JT_OUTER)!=0;

    /* When the NATURAL keyword is present, add WHERE clause terms for
    ** every column that the two tables have in common.
    */
    if( pRight->fg.jointype & JT_NATURAL ){
      if( pRight->pOn || pRight->pUsing ){
        sqlite3ErrorMsg(pParse, "a NATURAL join may not have "
           "an ON or USING clause", 0);
        return 1;
      }
      for(j=0; j<pRightTab->nCol; j++){
        char *zName;   /* Name of column in the right table */
        int iLeft;     /* Matching left table */
        int iLeftCol;  /* Matching column in the left table */

        zName = pRightTab->aCol[j].zName;
        if( tableAndColumnIndex(pSrc, i+1, zName, &iLeft, &iLeftCol) ){
          addWhereTerm(pParse, pSrc, iLeft, iLeftCol, i+1, j,
                       isOuter, &p->pWhere);
        }
      }
    }

    /* Disallow both ON and USING clauses in the same join
    */
    if( pRight->pOn && pRight->pUsing ){
      sqlite3ErrorMsg(pParse, "cannot have both ON and USING "
        "clauses in the same join");
      return 1;
    }

    /* Add the ON clause to the end of the WHERE clause, connected by
    ** an AND operator.
    */
    if( pRight->pOn ){
      if( isOuter ) setJoinExpr(pRight->pOn, pRight->iCursor);
      p->pWhere = sqlite3ExprAnd(pParse->db, p->pWhere, pRight->pOn);
      pRight->pOn = 0;
    }

    /* Create extra terms on the WHERE clause for each column named
    ** in the USING clause.  Example: If the two tables to be joined are 
    ** A and B and the USING clause names X, Y, and Z, then add this
    ** to the WHERE clause:    A.X=B.X AND A.Y=B.Y AND A.Z=B.Z
    ** Report an error if any column mentioned in the USING clause is
    ** not contained in both tables to be joined.
    */
    if( pRight->pUsing ){
      IdList *pList = pRight->pUsing;
      for(j=0; j<pList->nId; j++){
        char *zName;     /* Name of the term in the USING clause */
        int iLeft;       /* Table on the left with matching column name */
        int iLeftCol;    /* Column number of matching column on the left */
        int iRightCol;   /* Column number of matching column on the right */

        zName = pList->a[j].zName;
        iRightCol = columnIndex(pRightTab, zName);
        if( iRightCol<0
         || !tableAndColumnIndex(pSrc, i+1, zName, &iLeft, &iLeftCol)
        ){
          sqlite3ErrorMsg(pParse, "cannot join using column %s - column "
            "not present in both tables", zName);
          return 1;
        }
        addWhereTerm(pParse, pSrc, iLeft, iLeftCol, i+1, iRightCol,
                     isOuter, &p->pWhere);
      }
    }
  }
  return 0;
}